

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O0

AmbientLight *
embree::SceneGraph::AmbientLight::lerp(AmbientLight *light0,AmbientLight *light1,float f)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long in_RDX;
  long in_RSI;
  AmbientLight *in_RDI;
  float in_XMM0_Da;
  Vec3fa *in_stack_fffffffffffffd98;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 *local_210;
  undefined8 *local_208;
  undefined8 *local_200;
  undefined1 local_1f8 [16];
  undefined8 *local_1e8;
  undefined8 *local_1d8;
  undefined8 *local_1d0;
  undefined1 *local_1c8;
  undefined8 *local_1c0;
  undefined1 *local_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined8 *local_170;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 *local_138;
  undefined8 *local_130;
  float local_124;
  undefined8 *local_120;
  float local_114;
  undefined8 *local_110;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 *local_d8;
  undefined8 *local_d0;
  undefined8 *local_c8;
  undefined8 *local_c0;
  undefined8 *local_b8;
  undefined8 *local_b0;
  undefined8 *local_a8;
  undefined8 *local_a0;
  undefined8 *local_98;
  undefined8 *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined8 *local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined8 *local_30;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_208 = (undefined8 *)(in_RSI + 0x10);
  local_210 = (undefined8 *)(in_RDX + 0x10);
  local_200 = &local_258;
  local_124 = 1.0 - in_XMM0_Da;
  local_1d8 = &local_228;
  local_1c8 = local_1f8;
  uVar1 = *local_210;
  uVar2 = *(undefined8 *)(in_RDX + 0x18);
  local_1a8._0_4_ = (float)uVar1;
  local_1a8._4_4_ = (float)((ulong)uVar1 >> 0x20);
  uStack_1a0._0_4_ = (float)uVar2;
  uStack_1a0._4_4_ = (float)((ulong)uVar2 >> 0x20);
  local_188 = in_XMM0_Da * (float)local_1a8;
  fStack_184 = in_XMM0_Da * local_1a8._4_4_;
  fStack_180 = in_XMM0_Da * (float)uStack_1a0;
  fStack_17c = in_XMM0_Da * uStack_1a0._4_4_;
  local_110 = &local_148;
  local_78 = CONCAT44(local_124,local_124);
  uStack_70 = CONCAT44(local_124,local_124);
  local_c0 = &local_258;
  local_c8 = &local_148;
  local_90 = &local_e8;
  uVar3 = *local_208;
  uVar4 = *(undefined8 *)(in_RSI + 0x18);
  local_88._0_4_ = (float)uVar3;
  local_88._4_4_ = (float)((ulong)uVar3 >> 0x20);
  uStack_80._0_4_ = (float)uVar4;
  uStack_80._4_4_ = (float)((ulong)uVar4 >> 0x20);
  local_68 = local_124 * (float)local_88;
  fStack_64 = local_124 * local_88._4_4_;
  fStack_60 = local_124 * (float)uStack_80;
  fStack_5c = local_124 * uStack_80._4_4_;
  local_50 = &local_e8;
  local_18 = CONCAT44(fStack_64,local_68);
  uStack_10 = CONCAT44(fStack_5c,fStack_60);
  local_a8 = &local_258;
  local_b0 = &local_e8;
  local_28 = (float)local_228;
  fStack_24 = (float)((ulong)local_228 >> 0x20);
  fStack_20 = (float)uStack_220;
  fStack_1c = (float)((ulong)uStack_220 >> 0x20);
  local_48 = local_68 + local_28;
  fStack_44 = fStack_64 + fStack_24;
  fStack_40 = fStack_60 + fStack_20;
  fStack_3c = fStack_5c + fStack_1c;
  local_30 = &local_258;
  local_258 = CONCAT44(fStack_44,local_48);
  uStack_250 = CONCAT44(fStack_3c,fStack_40);
  local_1e8 = local_210;
  local_1d0 = local_210;
  local_1c0 = local_1d8;
  local_1b0 = local_1c8;
  local_1a8 = uVar1;
  uStack_1a0 = uVar2;
  local_170 = local_1d8;
  local_138 = local_1d8;
  local_130 = local_208;
  local_120 = local_200;
  local_114 = local_124;
  local_108 = local_124;
  fStack_104 = local_124;
  fStack_100 = local_124;
  fStack_fc = local_124;
  local_f8 = local_124;
  local_d8 = local_1d8;
  local_d0 = local_208;
  local_b8 = local_1d8;
  local_a0 = local_208;
  local_98 = local_c8;
  local_88 = uVar3;
  uStack_80 = uVar4;
  local_228 = CONCAT44(fStack_184,local_188);
  uStack_220 = CONCAT44(fStack_17c,fStack_180);
  local_148 = local_78;
  uStack_140 = uStack_70;
  local_e8 = local_18;
  uStack_e0 = uStack_10;
  AmbientLight(in_RDI,in_stack_fffffffffffffd98);
  return in_RDI;
}

Assistant:

static AmbientLight lerp(const AmbientLight& light0, const AmbientLight& light1, const float f) {
        return AmbientLight(embree::lerp(light0.L,light1.L,f));
      }